

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::python::Generator::ModuleLevelMessageName_abi_cxx11_
          (string *__return_storage_ptr__,Generator *this,Descriptor *descriptor)

{
  size_t *psVar1;
  char *pcVar2;
  char *in_R8;
  string_view filename;
  string_view separator;
  string local_f0;
  undefined1 local_d0 [80];
  AlphaNum local_80;
  AlphaNum local_50;
  
  separator._M_str = in_R8;
  separator._M_len = (size_t)".";
  pcVar2 = ".";
  NamePrefixedWithNestedTypes<google::protobuf::Descriptor>
            (__return_storage_ptr__,(python *)descriptor,(Descriptor *)0x1,separator);
  if (*(FileDescriptor **)(descriptor + 0x10) != this->file_) {
    psVar1 = *(size_t **)(*(FileDescriptor **)(descriptor + 0x10) + 8);
    filename._M_str = pcVar2;
    filename._M_len = *psVar1;
    (anonymous_namespace)::ModuleAlias_abi_cxx11_
              (&local_f0,(_anonymous_namespace_ *)psVar1[1],filename);
    local_50.piece_._M_len = local_f0._M_string_length;
    local_50.piece_._M_str = local_f0._M_dataplus._M_p;
    local_80.piece_._M_len = 1;
    local_80.piece_._M_str = ".";
    local_d0._40_8_ = (__return_storage_ptr__->_M_dataplus)._M_p;
    local_d0._32_8_ = __return_storage_ptr__->_M_string_length;
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_d0,&local_50,&local_80);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_d0);
    if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
      operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Generator::ModuleLevelMessageName(
    const Descriptor& descriptor) const {
  std::string name = NamePrefixedWithNestedTypes(descriptor, ".");
  if (descriptor.file() != file_) {
    name = absl::StrCat(ModuleAlias(descriptor.file()->name()), ".", name);
  }
  return name;
}